

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O3

void Cov_ManFree(Cov_Man_t *p)

{
  void *__ptr;
  void **__ptr_00;
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pVVar3 = p->vObjStrs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)pVVar3->pArray[lVar4] + 0x18);
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
        pVVar3 = p->vObjStrs;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  Min_ManFree(p->pManMin);
  pVVar3 = p->vObjStrs;
  __ptr_00 = pVVar3->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(pVVar3);
  pVVar1 = p->vFanCounts;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTriv0;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTriv1;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vComTo0;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vComTo1;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPairs0;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPairs1;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  if (p->pMemory != (void *)0x0) {
    free(p->pMemory);
  }
  free(p);
  return;
}

Assistant:

void Cov_ManFree( Cov_Man_t * p )
{
    Vec_Int_t * vSupp;
    int i;
    for ( i = 0; i < p->vObjStrs->nSize; i++ )
    {
        vSupp = ((Cov_Obj_t *)p->vObjStrs->pArray[i])->vSupp;
        if ( vSupp ) Vec_IntFree( vSupp );
    }

    Min_ManFree( p->pManMin );
    Vec_PtrFree( p->vObjStrs );
    Vec_IntFree( p->vFanCounts );
    Vec_IntFree( p->vTriv0 );
    Vec_IntFree( p->vTriv1 );
    Vec_IntFree( p->vComTo0 );
    Vec_IntFree( p->vComTo1 );
    Vec_IntFree( p->vPairs0 );
    Vec_IntFree( p->vPairs1 );
    ABC_FREE( p->pMemory );
    ABC_FREE( p );
}